

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O0

bool fs_is_file(string_view path)

{
  string_view path_00;
  bool bVar1;
  _Bool _Var2;
  bool local_7b;
  bool local_79;
  path local_58;
  undefined1 local_30 [8];
  error_code ec;
  undefined1 auStack_18 [7];
  bool ok;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  _auStack_18 = path._M_len;
  std::error_code::error_code((error_code *)local_30);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_58,(basic_string_view<char,_std::char_traits<char>_> *)auStack_18,auto_format);
  bVar1 = std::filesystem::is_regular_file(&local_58,(error_code *)local_30);
  if (bVar1) {
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_30);
    local_79 = true;
    if (!bVar1) goto LAB_00120a59;
  }
  _Var2 = fs_is_msvc();
  local_7b = false;
  if (_Var2) {
    path_00._M_str = (char *)path_local._M_len;
    path_00._M_len = _auStack_18;
    local_7b = fs_is_appexec_alias(path_00);
  }
  local_79 = local_7b;
LAB_00120a59:
  ec._M_cat._7_1_ = local_79;
  std::filesystem::__cxx11::path::~path(&local_58);
  return (bool)(ec._M_cat._7_1_ & 1);
}

Assistant:

bool
fs_is_file(std::string_view path)
{
  // is path a regular file or a symlink to a regular file.
  // not a directory, device, or symlink to a directory.
  // stat() doesn't detect App Execution Aliases
  // AppExec Alias have FILE_ATTRIBUTE_REPARSE_POINT | FILE_ATTRIBUTE_ARCHIVE
  // but need to check the reparse point data for IO_REPARSE_TAG_APPEXECLINK

  bool ok;
#if defined(HAVE_CXX_FILESYSTEM)
  std::error_code ec;
  ok = (std::filesystem::is_regular_file(path, ec) && !ec) ||
        (fs_is_msvc() && fs_is_appexec_alias(path));
#elif defined(_WIN32)
  ok = fs_win32_is_type(path, FILE_TYPE_DISK) || fs_is_appexec_alias(path);
#else
  ok = S_ISREG(fs_st_mode(path));
#endif

  return ok;
}